

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_attr<float>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<float>_> *attr,string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Path *v;
  byte bVar2;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  pprint *ppVar7;
  pointer pPVar8;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  long lVar9;
  byte bVar10;
  char *pcVar11;
  byte bVar12;
  stringstream ss;
  string local_248;
  pprint *local_228;
  uint32_t local_21c;
  string *local_218;
  byte local_210;
  float local_208;
  undefined2 local_204;
  TypedTimeSamples<float> local_200;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ppVar7 = (pprint *)CONCAT44(in_register_0000000c,indent);
  local_228 = ppVar7;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar5 = (attr->_attrib).has_value_;
  local_1e0 = __return_storage_ptr__;
  if (bVar5 == false) {
    pPVar8 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar8 == (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      if ((attr->_value_empty == false) && ((attr->_blocked & 1U) == 0)) goto LAB_001702bf;
      bVar10 = (attr->_blocked ^ 1U) & attr->_value_empty;
      bVar2 = 0;
      local_210 = bVar5;
    }
    else {
      bVar2 = 1;
      bVar10 = 0;
      local_210 = bVar5;
    }
  }
  else {
    local_208 = *(float *)&(attr->_attrib).contained;
    local_204 = *(undefined2 *)((long)&(attr->_attrib).contained + 4);
    local_210 = bVar5;
    std::
    vector<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
    ::vector(&local_200._samples,
             (vector<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
              *)((long)&(attr->_attrib).contained + 8));
    local_200._dirty = *(bool *)((long)&(attr->_attrib).contained + 0x20);
    pPVar8 = (pointer)CONCAT71((int7)((ulong)ppVar7 >> 8),local_200._dirty);
    bVar2 = 0;
    bVar10 = 0;
  }
  indent_00 = (uint32_t)pPVar8;
  if ((local_210 & 1) == 0) {
    bVar12 = 0;
    local_21c = 0;
  }
  else {
    bVar12 = (byte)local_204;
    if (((ulong)pPVar8 & 1) != 0) {
      TypedTimeSamples<float>::update(&local_200);
    }
    indent_00 = (uint32_t)
                CONCAT71((int7)((ulong)local_200._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_200._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_200._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    local_21c = indent_00;
  }
  if ((((local_210 & 1) == 0) || (local_204._1_1_ != '\0')) || ((byte)local_204 != '\0')) {
    bVar5 = false;
  }
  else {
    bVar5 = local_200._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_200._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar4 = AttrMetas::authored(&attr->_metas);
  if (((bVar4) || (!(bool)(bVar2 | bVar5))) ||
     (n_01 = n, ((bVar10 | attr->_blocked | bVar12) & 1) != 0)) {
    pprint::Indent_abi_cxx11_(&local_248,local_228,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    paVar1 = &local_248.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                        local_248.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    local_248.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_248.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_248._M_string_length = 5;
    local_248._M_dataplus._M_p = (pointer)paVar1;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                        local_248.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if (attr->_blocked == true) {
      pcVar11 = " = None";
      lVar9 = 7;
LAB_0016ff58:
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,lVar9);
    }
    else if (bVar12 != 0) {
      if (local_210 == 0) goto LAB_00170318;
      if ((local_204._1_1_ != '\0') || ((byte)local_204 != '\x01')) {
        pcVar11 = " = [InternalError]";
        lVar9 = 0x12;
        goto LAB_0016ff58;
      }
      local_218 = (string *)(double)local_208;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      std::ostream::_M_insert<double>((double)local_218);
    }
    bVar5 = AttrMetas::authored(&attr->_metas);
    if (bVar5) {
      local_218 = name;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      ppVar7 = local_228;
      print_attr_metas_abi_cxx11_
                (&local_248,(tinyusdz *)attr,(AttrMeta *)(ulong)((int)local_228 + 1),indent_00);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)ppVar7 & 0xffffffff),n_00);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      name = local_218;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                          local_248.field_2._M_allocated_capacity._0_4_)) + 1);
        name = local_218;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)local_21c != '\0') {
    pprint::Indent_abi_cxx11_(&local_248,local_228,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    paVar1 = &local_248.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                        local_248.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    local_248.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_248.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_248._M_string_length = 5;
    local_248._M_dataplus._M_p = (pointer)paVar1;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                        local_248.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_210 == 0) {
LAB_00170318:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::value() const [T = tinyusdz::Animatable<float>]"
                   );
    }
    print_typed_timesamples<float>(&local_248,&local_200,(uint32_t)local_228);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                        local_248.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_248,local_228,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    paVar1 = &local_248.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                        local_248.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    local_248.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_248.field_2._M_allocated_capacity._4_2_ = 0x74;
    local_248._M_string_length = 5;
    local_248._M_dataplus._M_p = (pointer)paVar1;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT26(local_248.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_248.field_2._M_allocated_capacity._4_2_,
                                        local_248.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar9 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar9 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar9 == 1) {
      std::operator<<(local_1a8,v);
    }
    else {
      std::operator<<(local_1a8,&attr->_paths);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  if ((local_210 == 1) &&
     (local_200._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_200._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_200._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_200._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_001702bf:
  psVar3 = local_1e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}